

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

void __thiscall
helics::FederateState::execCallbackProcessing(FederateState *this,IterationResult result)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  IterationRequest iterate;
  uint extraout_EDX;
  undefined7 in_register_00000031;
  ActionMessage bye;
  ActionMessage AStack_d8;
  
  peVar1 = (this->fedCallbacks).
           super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar2 = (*peVar1->_vptr_FederateOperator[3])
                    (peVar1,(this->time_granted).internalTimeCode,
                     CONCAT71(in_register_00000031,result) & 0xffffffff);
  iterate = (IterationRequest)extraout_EDX;
  if (iterate == HALT_OPERATIONS) {
    ActionMessage::ActionMessage(&AStack_d8,cmd_disconnect);
    AStack_d8.source_id.gid = (this->global_id)._M_i.gid;
    AStack_d8.dest_id.gid = AStack_d8.source_id.gid;
    BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&AStack_d8);
  }
  else if ((extraout_EDX & 0xff) == 7) {
    ActionMessage::ActionMessage(&AStack_d8,cmd_local_error);
    AStack_d8.source_id.gid = (this->global_id)._M_i.gid;
    AStack_d8.messageID = -0x1d;
    AStack_d8.dest_id.gid = AStack_d8.source_id.gid;
    SmallBuffer::operator=
              (&AStack_d8.payload,
               (char (*) [68])"Callback federate unspecified error condition in executing callback")
    ;
    BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&AStack_d8);
  }
  else {
    ActionMessage::ActionMessage(&AStack_d8,cmd_time_request);
    AStack_d8.source_id.gid = (this->global_id)._M_i.gid;
    AStack_d8.dest_id.gid = AStack_d8.source_id.gid;
    AStack_d8.actionTime.internalTimeCode = CONCAT44(extraout_var,iVar2);
    setIterationFlags(&AStack_d8,iterate);
    AStack_d8.flags._0_1_ = (byte)AStack_d8.flags | 0x20;
    BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&AStack_d8);
  }
  ActionMessage::~ActionMessage(&AStack_d8);
  this->lastIterationRequest = iterate;
  return;
}

Assistant:

void FederateState::execCallbackProcessing(IterationResult result)
{
    auto execIter = fedCallbacks->operate({grantedTime(), result});
    switch (execIter.second) {
        case IterationRequest::NO_ITERATIONS:
        case IterationRequest::ITERATE_IF_NEEDED:
        case IterationRequest::FORCE_ITERATION:
        default: {
            ActionMessage treq(CMD_TIME_REQUEST);
            treq.source_id = global_id.load();
            treq.dest_id = treq.source_id;
            treq.actionTime = execIter.first;
            setIterationFlags(treq, execIter.second);
            setActionFlag(treq, indicator_flag);
            mParent->addActionMessage(treq);
        } break;
        case IterationRequest::HALT_OPERATIONS: {
            ActionMessage bye(CMD_DISCONNECT);
            bye.source_id = global_id.load();
            bye.dest_id = bye.source_id;
            mParent->addActionMessage(bye);
        } break;
        case IterationRequest::ERROR_CONDITION:
            ActionMessage bye(CMD_LOCAL_ERROR);
            bye.source_id = global_id.load();
            bye.dest_id = bye.source_id;
            bye.messageID = HELICS_USER_EXCEPTION;
            bye.payload = "Callback federate unspecified error condition in executing callback";
            mParent->addActionMessage(bye);
            break;
    }
    lastIterationRequest = execIter.second;
}